

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_cmp(BIGNUM *a,BIGNUM *b)

{
  unsigned_long t2;
  unsigned_long t1;
  int lt;
  int gt;
  int i;
  BIGNUM *b_local;
  BIGNUM *a_local;
  int local_4;
  
  if ((a == (BIGNUM *)0x0) || (b == (BIGNUM *)0x0)) {
    if (a == (BIGNUM *)0x0) {
      if (b == (BIGNUM *)0x0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = -1;
    }
  }
  else if (a->neg == b->neg) {
    if (a->neg == 0) {
      gt = 1;
      lt = -1;
    }
    else {
      gt = -1;
      lt = 1;
    }
    if (b->top < a->top) {
      local_4 = gt;
    }
    else if (a->top < b->top) {
      local_4 = lt;
    }
    else {
      i = a->top;
      do {
        i = i + -1;
        if (i < 0) {
          return 0;
        }
        if (b->d[i] < a->d[i]) {
          return gt;
        }
      } while (b->d[i] <= a->d[i]);
      local_4 = lt;
    }
  }
  else if (a->neg == 0) {
    local_4 = 1;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int BN_cmp(const BIGNUM *a, const BIGNUM *b)
{
    int i;
    int gt, lt;
    BN_ULONG t1, t2;

    if ((a == NULL) || (b == NULL)) {
        if (a != NULL)
            return (-1);
        else if (b != NULL)
            return (1);
        else
            return (0);
    }

    bn_check_top(a);
    bn_check_top(b);

    if (a->neg != b->neg) {
        if (a->neg)
            return (-1);
        else
            return (1);
    }
    if (a->neg == 0) {
        gt = 1;
        lt = -1;
    } else {
        gt = -1;
        lt = 1;
    }

    if (a->top > b->top)
        return (gt);
    if (a->top < b->top)
        return (lt);
    for (i = a->top - 1; i >= 0; i--) {
        t1 = a->d[i];
        t2 = b->d[i];
        if (t1 > t2)
            return (gt);
        if (t1 < t2)
            return (lt);
    }
    return (0);
}